

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sinfl.h
# Opt level: O2

void sinfl_refill(sinfl *s)

{
  uint uVar1;
  int iVar2;
  long *__src;
  long lVar3;
  int iVar4;
  unsigned_long_long n;
  
  __src = (long *)s->bitptr;
  lVar3 = (long)s->bitend - (long)__src;
  if (lVar3 < 8) {
    iVar2 = s->bitcnt;
    iVar4 = 0x3f - iVar2 >> 3;
    if (lVar3 <= iVar4) {
      iVar4 = (int)lVar3;
    }
    n = 0;
    memcpy(&n,__src,(long)iVar4);
    s->bitbuf = s->bitbuf | n << ((byte)iVar2 & 0x3f);
    s->bitptr = (uchar *)((long)__src + (long)iVar4);
    s->bitcnt = iVar2 + iVar4 * 8;
  }
  else {
    uVar1 = s->bitcnt;
    s->bitbuf = s->bitbuf | *__src << ((byte)uVar1 & 0x3f);
    s->bitptr = (uchar *)((long)((int)(0x3f - uVar1) >> 3) + (long)__src);
    s->bitcnt = uVar1 | 0x38;
  }
  return;
}

Assistant:

static void
sinfl_refill(struct sinfl *s) {
  if (s->bitend - s->bitptr >= 8) {
      // @raysan5: original code, only those 3 lines
      s->bitbuf |= sinfl_read64(s->bitptr) << s->bitcnt;
      s->bitptr += (63 - s->bitcnt) >> 3;
      s->bitcnt |= 56; /* bitcount in range [56,63] */
  } else {
      // @raysan5: added this case when bits remaining < 8
      int bitswant = 63 - s->bitcnt;
      int byteswant = bitswant >> 3;
      int bytesuse = s->bitend - s->bitptr <= byteswant ? (int)(s->bitend - s->bitptr) : byteswant;
      unsigned long long n = 0;
      memcpy(&n, s->bitptr, bytesuse);
      s->bitbuf |= n << s->bitcnt;
      s->bitptr += bytesuse;
      s->bitcnt += bytesuse << 3;
  }
}